

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O3

void __thiscall OpenMesh::PropertyT<short>::swap(PropertyT<short> *this,size_t _i0,size_t _i1)

{
  short sVar1;
  pointer psVar2;
  
  psVar2 = (this->data_).super__Vector_base<short,_std::allocator<short>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar1 = psVar2[_i0];
  psVar2[_i0] = psVar2[_i1];
  psVar2[_i1] = sVar1;
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }